

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O3

void __thiscall xray_re::xr_memory_writer::~xr_memory_writer(xr_memory_writer *this)

{
  pointer puVar1;
  
  (this->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_memory_writer_0024b448;
  puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_writer_0024b410;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &(this->super_xr_writer).m_open_chunks);
  return;
}

Assistant:

xr_memory_writer::~xr_memory_writer() {}